

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O3

int __thiscall llvm::StringMapImpl::init(StringMapImpl *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  StringMapEntryBase *pSVar2;
  long lVar3;
  int iVar4;
  StringMapEntryBase **ppSVar5;
  size_t sVar6;
  size_t __n;
  void *__s1;
  uint uVar7;
  StringMapImpl *this_00;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar10 = (uint)ctx;
  if ((uVar10 & uVar10 - 1) != 0) {
    __assert_fail("(InitSize & (InitSize-1)) == 0 && \"Init Size must be a power of 2 or zero!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/StringMap.cpp"
                  ,0x36,"void llvm::StringMapImpl::init(unsigned int)");
  }
  uVar12 = 0x10;
  if (uVar10 != 0) {
    uVar12 = (ulong)ctx & 0xffffffff;
  }
  this->NumItems = 0;
  this->NumTombstones = 0;
  uVar10 = (uint)uVar12 + 1;
  this_00 = (StringMapImpl *)(ulong)uVar10;
  __s1 = (void *)0xc;
  ppSVar5 = (StringMapEntryBase **)calloc((size_t)this_00,0xc);
  if (ppSVar5 != (StringMapEntryBase **)0x0) {
LAB_00da0ec0:
    this->TheTable = ppSVar5;
    this->NumBuckets = (uint)uVar12;
    ppSVar5[uVar12] = (StringMapEntryBase *)0x2;
    return (int)ppSVar5;
  }
  if (uVar10 == 0) {
    this_00 = (StringMapImpl *)0x1;
    ppSVar5 = (StringMapEntryBase **)malloc(1);
    if (ppSVar5 != (StringMapEntryBase **)0x0) goto LAB_00da0ec0;
  }
  else {
    init((EVP_PKEY_CTX *)this_00);
  }
  init((EVP_PKEY_CTX *)this_00);
  uVar10 = this_00->NumBuckets;
  if (uVar10 == 0) {
    init(this_00,(EVP_PKEY_CTX *)0x10);
    uVar10 = this_00->NumBuckets;
  }
  if (__n == 0) {
    uVar9 = 0;
  }
  else {
    sVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 * 0x21 + (uint)*(byte *)((long)__s1 + sVar6);
      sVar6 = sVar6 + 1;
    } while (__n != sVar6);
  }
  ppSVar5 = this_00->TheTable;
  lVar3 = (ulong)uVar10 * 8 + 8;
  uVar1 = this_00->ItemSize;
  iVar8 = 1;
  uVar7 = 0xffffffff;
  uVar11 = uVar9;
  do {
    uVar11 = uVar11 & uVar10 - 1;
    uVar12 = (ulong)uVar11;
    pSVar2 = ppSVar5[uVar12];
    if (pSVar2 == (StringMapEntryBase *)0x0) {
      if (uVar7 != 0xffffffff) {
        uVar11 = uVar7;
        uVar12 = (long)(int)uVar7;
      }
      *(uint *)((long)ppSVar5 + uVar12 * 4 + lVar3) = uVar9;
      return uVar11;
    }
    if (pSVar2 == (StringMapEntryBase *)0xfffffffffffffff8) {
      if (uVar7 == 0xffffffff) {
        uVar7 = uVar11;
      }
    }
    else if ((*(uint *)((long)ppSVar5 + uVar12 * 4 + lVar3) == uVar9) && (pSVar2->StrLen == __n)) {
      if (__n == 0) {
        return uVar11;
      }
      iVar4 = bcmp(__s1,(void *)((long)&pSVar2->StrLen + (ulong)uVar1),__n);
      if (iVar4 == 0) {
        return uVar11;
      }
    }
    uVar11 = uVar11 + iVar8;
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void StringMapImpl::init(unsigned InitSize) {
  assert((InitSize & (InitSize-1)) == 0 &&
         "Init Size must be a power of 2 or zero!");

  unsigned NewNumBuckets = InitSize ? InitSize : 16;
  NumItems = 0;
  NumTombstones = 0;

  TheTable = static_cast<StringMapEntryBase **>(
      safe_calloc(NewNumBuckets+1,
                  sizeof(StringMapEntryBase **) + sizeof(unsigned)));

  // Set the member only if TheTable was successfully allocated
  NumBuckets = NewNumBuckets;

  // Allocate one extra bucket, set it to look filled so the iterators stop at
  // end.
  TheTable[NumBuckets] = (StringMapEntryBase*)2;
}